

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

void __thiscall front::syntax::SyntaxAnalyze::gm_block(SyntaxAnalyze *this)

{
  pointer pWVar1;
  bool bVar2;
  ulong uVar3;
  
  match_one_word(this,LBRACE);
  this->layer_num = this->layer_num + 1;
  do {
    uVar3 = this->matched_index + 1;
    pWVar1 = (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar3 < (ulong)(((long)(this->word_list->
                               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                       -0x5555555555555555)) {
      bVar2 = word::Word::match_token(pWVar1 + uVar3,RBRACE);
      if (bVar2) {
        symbolTable::SymbolTable::pop_layer_symbols(&this->symbolTable,this->layer_num);
        this->layer_num = this->layer_num - 1;
        match_one_word(this,RBRACE);
        return;
      }
    }
    gm_block_item(this);
  } while( true );
}

Assistant:

void SyntaxAnalyze::gm_block() {
  match_one_word(Token::LBRACE);
  in_layer();

  while (!try_word(1, Token::RBRACE)) {
    gm_block_item();
  }

  out_layer();
  match_one_word(Token::RBRACE);
}